

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxList.cpp
# Opt level: O0

BoxList * __thiscall amrex::BoxList::intersect(BoxList *this,Box *b)

{
  bool bVar1;
  BoxList *in_RDI;
  Box *isect;
  Box *bx;
  iterator __end1;
  iterator __begin1;
  Vector<amrex::Box,_std::allocator<amrex::Box>_> *__range1;
  Box *in_stack_ffffffffffffff90;
  pointer local_68;
  pointer local_60;
  uint local_58;
  Box local_54;
  Box *local_38;
  BoxList *in_stack_ffffffffffffffd0;
  __normal_iterator<amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
  local_20 [4];
  
  local_20[0]._M_current =
       (Box *)std::vector<amrex::Box,_std::allocator<amrex::Box>_>::begin
                        ((vector<amrex::Box,_std::allocator<amrex::Box>_> *)in_RDI);
  std::vector<amrex::Box,_std::allocator<amrex::Box>_>::end
            ((vector<amrex::Box,_std::allocator<amrex::Box>_> *)in_RDI);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
                        *)in_stack_ffffffffffffff90,
                       (__normal_iterator<amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
                        *)in_RDI);
    if (!bVar1) break;
    in_stack_ffffffffffffffd0 =
         (BoxList *)
         __gnu_cxx::
         __normal_iterator<amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>::
         operator*(local_20);
    Box::operator&(in_stack_ffffffffffffff90,(Box *)in_RDI);
    local_38 = &local_54;
    bVar1 = Box::ok(local_38);
    if (bVar1) {
      (in_stack_ffffffffffffffd0->m_lbox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_start = *(pointer *)(local_38->smallend).vect;
      (in_stack_ffffffffffffffd0->m_lbox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_finish = *(pointer *)((local_38->smallend).vect + 2);
      (in_stack_ffffffffffffffd0->m_lbox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = *(pointer *)((local_38->bigend).vect + 1);
      (in_stack_ffffffffffffffd0->btype).itype = (local_38->btype).itype;
    }
    else {
      Box::Box(in_stack_ffffffffffffff90);
      (in_stack_ffffffffffffffd0->m_lbox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_start = in_stack_ffffffffffffff90;
      (in_stack_ffffffffffffffd0->m_lbox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_68;
      (in_stack_ffffffffffffffd0->m_lbox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = local_60;
      (in_stack_ffffffffffffffd0->btype).itype = local_58;
    }
    __gnu_cxx::
    __normal_iterator<amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>::
    operator++(local_20);
  }
  removeEmpty(in_stack_ffffffffffffffd0);
  return in_RDI;
}

Assistant:

BoxList&
BoxList::intersect (const Box& b)
{
    BL_ASSERT(ixType() == b.ixType());

    for (Box& bx : m_lbox)
    {
        const Box& isect = bx & b;
        if (isect.ok())
        {
            bx = isect;
        }
        else
        {
            bx = Box();
        }
    }

    removeEmpty();

    return *this;
}